

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O2

_Bool helpscan(uchar *buf,size_t len,scan_ctx *ctx)

{
  char *__dest;
  char *__src;
  uchar uVar1;
  size_t sVar2;
  char *__s2;
  int iVar3;
  ulong uVar4;
  
  __dest = ctx->rbuf;
  __src = ctx->rbuf + 1;
  for (uVar4 = 0; len != uVar4; uVar4 = uVar4 + 1) {
    if (ctx->show == '\x01') {
      sVar2 = ctx->flen;
      memmove(__dest,__src,sVar2 - 1);
      ctx->rbuf[sVar2 - 1] = buf[uVar4];
      __s2 = ctx->arg;
      iVar3 = bcmp(__dest,__s2,ctx->flen);
      if (iVar3 == 0) {
        fputs(__s2 + 1,_stdout);
LAB_00113559:
        ctx->show = ctx->show + '\x01';
      }
    }
    else if (ctx->show == '\0') {
      sVar2 = ctx->tlen;
      memmove(__dest,__src,sVar2 - 1);
      ctx->rbuf[sVar2 - 1] = buf[uVar4];
      iVar3 = bcmp(__dest,ctx->trigger,ctx->tlen);
      if (iVar3 == 0) goto LAB_00113559;
    }
    else {
      sVar2 = ctx->elen;
      memmove(__dest,__src,sVar2 - 1);
      uVar1 = buf[uVar4];
      ctx->rbuf[sVar2 - 1] = uVar1;
      iVar3 = bcmp(__dest,ctx->endarg,ctx->elen);
      if (iVar3 == 0) break;
      sVar2 = ctx->olen;
      if (uVar1 == '\n') {
        if (sVar2 == 0xa0) break;
        ctx->obuf[sVar2] = '\0';
        ctx->olen = 0;
        puts(ctx->obuf);
      }
      else {
        if (sVar2 == 0xa0) break;
        ctx->olen = sVar2 + 1;
        ctx->obuf[sVar2] = uVar1;
      }
    }
  }
  return len <= uVar4;
}

Assistant:

bool helpscan(const unsigned char *buf, size_t len, struct scan_ctx *ctx)
{
  size_t i;
  for(i = 0; i < len; i++) {
    if(!ctx->show) {
      /* wait for the trigger */
      memmove(&ctx->rbuf[0], &ctx->rbuf[1], ctx->tlen - 1);
      ctx->rbuf[ctx->tlen - 1] = buf[i];
      if(!memcmp(ctx->rbuf, ctx->trigger, ctx->tlen))
        ctx->show++;
      continue;
    }
    /* past the trigger */
    if(ctx->show == 1) {
      memmove(&ctx->rbuf[0], &ctx->rbuf[1], ctx->flen - 1);
      ctx->rbuf[ctx->flen - 1] = buf[i];
      if(!memcmp(ctx->rbuf, ctx->arg, ctx->flen)) {
        /* match, now output until endarg */
        fputs(&ctx->arg[1], stdout);
        ctx->show++;
      }
      continue;
    }
    /* show until the end */
    memmove(&ctx->rbuf[0], &ctx->rbuf[1], ctx->elen - 1);
    ctx->rbuf[ctx->elen - 1] = buf[i];
    if(!memcmp(ctx->rbuf, ctx->endarg, ctx->elen))
      return FALSE;

    if(buf[i] == '\n') {
      DEBUGASSERT(ctx->olen < sizeof(ctx->obuf));
      if(ctx->olen == sizeof(ctx->obuf))
        return FALSE; /* bail out */
      ctx->obuf[ctx->olen++] = 0;
      ctx->olen = 0;
      puts(ctx->obuf);
    }
    else {
      DEBUGASSERT(ctx->olen < sizeof(ctx->obuf));
      if(ctx->olen == sizeof(ctx->obuf))
        return FALSE; /* bail out */
      ctx->obuf[ctx->olen++] = buf[i];
    }
  }
  return TRUE;
}